

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O2

QString * QSysInfo::kernelVersion(void)

{
  long lVar1;
  int iVar2;
  QString *this;
  storage_type *in_RCX;
  QString *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView ba;
  utsname u;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset((utsname *)&u,0xaa,0x186);
  iVar2 = uname((utsname *)&u);
  if (iVar2 == 0) {
    this = (QString *)QByteArrayView::lengthHelperCharArray(u.release,0x41);
    ba.m_data = in_RCX;
    ba.m_size = (qsizetype)u.release;
    QString::fromLatin1(in_RDI,this,ba);
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) goto LAB_00205d61;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
LAB_00205d61:
      __stack_chk_fail();
    }
    (in_RDI->d).d = (Data *)0x0;
    (in_RDI->d).ptr = (char16_t *)0x0;
    (in_RDI->d).size = 0;
  }
  return in_RDI;
}

Assistant:

QString QSysInfo::kernelVersion()
{
#ifdef Q_OS_WIN
    const auto osver = QOperatingSystemVersion::current();
    return QString::asprintf("%d.%d.%d",
                             osver.majorVersion(), osver.minorVersion(), osver.microVersion());
#else
    struct utsname u;
    if (uname(&u) == 0) {
#   ifdef Q_OS_VXWORKS
        // The string follows the pattern "Core Kernel version: w.x.y.z"
        auto versionStr = QByteArrayView(u.kernelversion);
        if (auto lastSpace = versionStr.lastIndexOf(' '); lastSpace != -1) {
            return QString::fromLatin1(versionStr.sliced(lastSpace + 1));
        }
#   else
        return QString::fromLatin1(u.release);
#   endif
    }
    return QString();
#endif
}